

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O3

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC,int is)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  uVar1 = 0xffffffd7;
  if ((0 < is) && (is < MRIC->stages)) {
    if ((MRIC->G == (sunrealtype ***)0x0) || ((long)MRIC->nmat < 1)) {
      dVar4 = MRIC->c[(uint)is] - MRIC->c[(ulong)(uint)is - 1];
    }
    else {
      dVar3 = 0.0;
      lVar2 = 0;
      do {
        dVar3 = dVar3 + ABS(MRIC->G[lVar2][(uint)is][(uint)is]);
        lVar2 = lVar2 + 1;
      } while (MRIC->nmat != lVar2);
      dVar4 = MRIC->c[(uint)is] - MRIC->c[(ulong)(uint)is - 1];
      if (2.220446049250313e-14 < dVar3) {
        return 2.220446049250313e-14 < dVar4 | 2;
      }
    }
    uVar1 = (uint)(dVar4 <= 2.220446049250313e-14);
  }
  return uVar1;
}

Assistant:

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC, int is)
{
  int i;
  sunrealtype Gabs, cdiff;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  if ((is < 1) || (is >= MRIC->stages)) { return ARK_INVALID_TABLE; }

  /* sum of stage diagonal entries across implicit tables */
  Gabs = ZERO;
  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++) { Gabs += SUNRabs(MRIC->G[i][is][is]); }
  }

  /* abscissae difference */
  cdiff = MRIC->c[is] - MRIC->c[is - 1];

  if (Gabs > tol)
  { /* DIRK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_DIRK_FAST);
    }
    else { return (MRISTAGE_DIRK_NOFAST); }
  }
  else
  { /* ERK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_ERK_FAST);
    }
    else { return (MRISTAGE_ERK_NOFAST); }
  }
}